

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O2

FT_Error ft_new_glyph(FT_Library library,FT_Glyph_Class *clazz,FT_Glyph *aglyph)

{
  FT_Memory memory;
  undefined8 in_RAX;
  FT_Glyph pFVar1;
  FT_Error error;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  memory = library->memory;
  *aglyph = (FT_Glyph)0x0;
  pFVar1 = (FT_Glyph)ft_mem_alloc(memory,clazz->glyph_size,&local_24);
  if (local_24 == 0) {
    pFVar1->library = library;
    pFVar1->clazz = clazz;
    pFVar1->format = clazz->glyph_format;
    *aglyph = pFVar1;
  }
  return local_24;
}

Assistant:

static FT_Error
   ft_new_glyph( FT_Library             library,
                 const FT_Glyph_Class*  clazz,
                 FT_Glyph*              aglyph )
   {
     FT_Memory  memory = library->memory;
     FT_Error   error;
     FT_Glyph   glyph  = NULL;


     *aglyph = NULL;

     if ( !FT_ALLOC( glyph, clazz->glyph_size ) )
     {
       glyph->library = library;
       glyph->clazz   = clazz;
       glyph->format  = clazz->glyph_format;

       *aglyph = glyph;
     }

     return error;
   }